

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

ConductorMaterial *
pbrt::ConductorMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  ConductorMaterial *pCVar2;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool remapRoughness;
  FloatTextureHandle displacement;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  SpectrumTextureHandle k;
  SpectrumTextureHandle eta;
  string *in_stack_fffffffffffffd18;
  TextureParameterDictionary *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd30;
  Float defaultValue;
  string *in_stack_fffffffffffffd38;
  FloatTextureHandle *args_4;
  TextureParameterDictionary *in_stack_fffffffffffffd40;
  Allocator in_stack_fffffffffffffd48;
  FloatTextureHandle *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  Allocator in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5;
  string *in_stack_fffffffffffffd78;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Allocator alloc_00;
  undefined8 local_239;
  undefined1 local_211;
  undefined8 local_210;
  undefined8 local_201;
  undefined8 local_1d8;
  undefined8 local_1c9;
  undefined8 local_1a0;
  allocator<char> local_191;
  string local_190 [40];
  undefined8 local_168;
  undefined1 local_159 [33];
  TaggedPointer local_138 [8];
  undefined8 local_130;
  undefined8 local_121;
  TaggedPointer local_100 [8];
  undefined8 local_f8;
  allocator<char> local_e9;
  string local_e8 [47];
  allocator<char> local_b9;
  string local_b8 [40];
  undefined8 local_90;
  allocator<char> local_81;
  string local_80 [63];
  allocator<char> local_41;
  string local_40 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  undefined8 local_8;
  
  defaultValue = (Float)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  GetNamedSpectrum(in_stack_fffffffffffffd38);
  local_90 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)in_stack_fffffffffffffd50,
             (string *)in_stack_fffffffffffffd48.memoryResource,
             (SpectrumHandle *)in_stack_fffffffffffffd40,
             (SpectrumType)((ulong)in_stack_fffffffffffffd38 >> 0x20),in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  GetNamedSpectrum(in_stack_fffffffffffffd38);
  local_f8 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)in_stack_fffffffffffffd50,
             (string *)in_stack_fffffffffffffd48.memoryResource,
             (SpectrumHandle *)in_stack_fffffffffffffd40,
             (SpectrumType)((ulong)in_stack_fffffffffffffd38 >> 0x20),in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  alloc_00.memoryResource = (memory_resource *)&local_121;
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  local_130 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this,in_stack_fffffffffffffd78,alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  name = (string *)local_159;
  args_5 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  local_168 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this,name,alloc_00);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_100);
  if (!bVar1) {
    in_stack_fffffffffffffd60 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
               (allocator<char> *)in_stack_fffffffffffffd50);
    local_1a0 = local_8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,defaultValue,
               in_stack_fffffffffffffd48);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffffd20,
               (FloatTextureHandle *)in_stack_fffffffffffffd18);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_138);
  if (!bVar1) {
    in_stack_fffffffffffffd58.memoryResource = (memory_resource *)&local_1c9;
    in_stack_fffffffffffffd50 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
               (allocator<char> *)in_stack_fffffffffffffd50);
    local_1d8 = local_8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,defaultValue,
               in_stack_fffffffffffffd48);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffffd20,
               (FloatTextureHandle *)in_stack_fffffffffffffd18);
    std::__cxx11::string::~string((string *)((long)&local_1c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  args_2 = (FloatTextureHandle *)&local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  local_210 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this,name,alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_201 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  args_4 = (FloatTextureHandle *)&local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffd50);
  bVar1 = TextureParameterDictionary::GetOneBool
                    (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,false);
  std::__cxx11::string::~string((string *)((long)&local_239 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  local_211 = bVar1;
  pCVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::ConductorMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,bool&>
                     ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd60,
                      (SpectrumTextureHandle *)in_stack_fffffffffffffd58.memoryResource,
                      (SpectrumTextureHandle *)in_stack_fffffffffffffd50,args_2,
                      (FloatTextureHandle *)local_10,args_4,(bool *)args_5);
  return pCVar2;
}

Assistant:

ConductorMaterial *ConductorMaterial::Create(const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle eta = parameters.GetSpectrumTexture(
        "eta", GetNamedSpectrum("metal-Cu-eta"), SpectrumType::General, alloc);
    SpectrumTextureHandle k = parameters.GetSpectrumTexture(
        "k", GetNamedSpectrum("metal-Cu-k"), SpectrumType::General, alloc);

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);
    return alloc.new_object<ConductorMaterial>(eta, k, uRoughness, vRoughness,
                                               displacement, remapRoughness);
}